

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGCircleElement::updateShape(SVGCircleElement *this,Path *path)

{
  Rect RVar1;
  float rx;
  float cx_00;
  float cy_00;
  float cy;
  float cx;
  float r;
  LengthContext lengthContext;
  Path *path_local;
  SVGCircleElement *this_local;
  undefined8 local_10;
  
  lengthContext._8_8_ = path;
  LengthContext::LengthContext((LengthContext *)&cx,(SVGElement *)this,UserSpaceOnUse);
  rx = LengthContext::valueForLength((LengthContext *)&cx,&this->m_r);
  if (0.0 < rx) {
    cx_00 = LengthContext::valueForLength((LengthContext *)&cx,&this->m_cx);
    cy_00 = LengthContext::valueForLength((LengthContext *)&cx,&this->m_cy);
    Path::addEllipse((Path *)lengthContext._8_8_,cx_00,cy_00,rx,rx);
    Rect::Rect((Rect *)&this_local,cx_00 - rx,cy_00 - rx,rx + rx,rx + rx);
  }
  else {
    this_local = (SVGCircleElement *)0x0;
    local_10._0_4_ = 0.0;
    local_10._4_4_ = 0.0;
  }
  RVar1.w = (float)local_10;
  RVar1.h = local_10._4_4_;
  RVar1._0_8_ = this_local;
  return RVar1;
}

Assistant:

Rect SVGCircleElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto r = lengthContext.valueForLength(m_r);
    if(r <= 0.f) {
        return Rect::Empty;
    }

    auto cx = lengthContext.valueForLength(m_cx);
    auto cy = lengthContext.valueForLength(m_cy);
    path.addEllipse(cx, cy, r, r);
    return Rect(cx - r, cy - r, r + r, r + r);
}